

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xio.c
# Opt level: O0

void * xio_CloneOption(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  void *result;
  void *value_local;
  char *name_local;
  
  if ((name == (char *)0x0) || (value == (void *)0x0)) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/xio.c"
                ,"xio_CloneOption",0xd6,1,
                "invalid argument detected: const char* name=%p, const void* value=%p",name,value);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    iVar1 = strcmp(name,CONCRETE_OPTIONS);
    if (iVar1 == 0) {
      l = (LOGGER_LOG)OptionHandler_Clone((OPTIONHANDLER_HANDLE)value);
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/src/xio.c"
                  ,"xio_CloneOption",0xe1,1,"unknown option: %s",name);
      }
      l = (LOGGER_LOG)0x0;
    }
  }
  return l;
}

Assistant:

static void* xio_CloneOption(const char* name, const void* value)
{
    void *result;
    if (
        (name == NULL) ||
        (value == NULL)
        )
    {
        LogError("invalid argument detected: const char* name=%p, const void* value=%p", name, value);
        result = NULL;
    }
    else
    {
        if (strcmp(name, CONCRETE_OPTIONS) == 0)
        {
            result = (void*)OptionHandler_Clone((OPTIONHANDLER_HANDLE)value);
        }
        else
        {
            LogError("unknown option: %s", name);
            result = NULL;
        }
    }
    return result;
}